

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::validateKTXswizzle(ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  bool bVar2;
  char *in_RCX;
  ulong uVar3;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_02;
  pointer pcVar4;
  int iVar5;
  pointer pcVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view string;
  basic_string_view<char,_std::char_traits<char>_> __x;
  uint32_t size_local;
  pointer local_68;
  string local_60;
  string_view value;
  ulong extraout_RDX_01;
  
  uVar3 = (ulong)size;
  this->foundKTXswizzle = true;
  size_local = size;
  if ((size == 0) || (data[size - 1] != '\0')) {
    error<>(this,&Metadata::KTXswizzleMissingNull);
    iVar5 = 0;
    uVar3 = extraout_RDX;
  }
  else {
    iVar5 = -1;
  }
  pcVar6 = (pointer)(ulong)(iVar5 + size);
  value._M_len = (size_t)pcVar6;
  value._M_str = (char *)data;
  if (iVar5 + size != 4) {
    error<unsigned_int&>(this,&Metadata::KTXswizzleInvalidSize,&size_local);
    uVar3 = extraout_RDX_00;
  }
  pcVar4 = (pointer)0x4;
  if (pcVar6 < (pointer)0x4) {
    pcVar4 = pcVar6;
  }
  local_68 = pcVar6;
  for (local_60._M_dataplus._M_p = (pointer)0x0; pcVar6 = local_68,
      local_60._M_dataplus._M_p < pcVar4; local_60._M_dataplus._M_p = local_60._M_dataplus._M_p + 1)
  {
    string._M_str._0_4_ = (int)(char)data[(long)local_60._M_dataplus._M_p];
    string._M_len = (size_t)"rgba01";
    string._M_str._4_4_ = 0;
    bVar2 = contains((ktx *)0x6,string,(char)in_RCX);
    uVar3 = extraout_RDX_01;
    if (!bVar2) {
      in_RCX = local_60._M_dataplus._M_p + (long)data;
      error<unsigned_long&,char_const&>
                (this,&Metadata::KTXswizzleInvalidValue,(unsigned_long *)&local_60,in_RCX);
      uVar3 = extraout_RDX_02;
    }
  }
  uVar1 = (this->header).vkFormat;
  if (uVar1 - 0x7c < 7) {
    toString_abi_cxx11_(&local_60,(ktx *)(ulong)uVar1,(VkFormat)uVar3);
    warning<std::__cxx11::string>(this,&Metadata::KTXswizzleWithDepthOrStencil,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (this->checkGLTFBasisU == true) {
    __y._M_str = "rgba";
    __y._M_len = 4;
    __x._M_str = (char *)data;
    __x._M_len = (size_t)pcVar6;
    bVar2 = std::operator!=(__x,__y);
    if (bVar2) {
      error<std::basic_string_view<char,std::char_traits<char>>const&>
                (this,&Metadata::KTXswizzleInvalidGLTFBU,&value);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateKTXswizzle(const uint8_t* data, uint32_t size) {
    foundKTXswizzle = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXswizzleMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != 4)
        error(Metadata::KTXswizzleInvalidSize, size);

    for (std::size_t i = 0; i < std::min(std::size_t{4}, value.size()); ++i) {
        if (value.size() > i && !contains("rgba01", value[i]))
            error(Metadata::KTXswizzleInvalidValue, i, value[i]);
    }

    if (isFormatStencil(VkFormat(header.vkFormat)) || isFormatDepth(VkFormat(header.vkFormat)))
        warning(Metadata::KTXswizzleWithDepthOrStencil, toString(VkFormat(header.vkFormat)));

    if (checkGLTFBasisU && value != "rgba")
        error(Metadata::KTXswizzleInvalidGLTFBU, value);
}